

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void set_get_meta_test(void)

{
  fdb_status fVar1;
  size_t keylen;
  char *__format;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_threshold = 0x400;
  fconfig.seqtree_opt = '\x01';
  fconfig.purging_interval = 1;
  fconfig.flags = fconfig.purging_interval;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&dbfile,"./dummy1",&fconfig);
  fdb_kvs_open(dbfile,&db,"db1",&kvs_config);
  sprintf(keybuf,"key%d",0);
  keylen = strlen(keybuf);
  fdb_doc_create(&rdoc,keybuf,keylen,(void *)0x0,0,(void *)0x0,0);
  fdb_set(db,rdoc);
  fVar1 = fdb_get(db,rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_byoffset(db,rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x347);
    set_get_meta_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x347,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_metaonly(db,rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x349,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_metaonly_byseq(db,rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x34b);
    set_get_meta_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x34b,"void set_get_meta_test()");
  }
  fdb_del(db,rdoc);
  fVar1 = fdb_get(db,rdoc);
  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
    __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x34f,"void set_get_meta_test()");
  }
  if (rdoc->deleted == false) {
    __assert_fail("rdoc->deleted == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x350,"void set_get_meta_test()");
  }
  fVar1 = fdb_get_metaonly(db,rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x353,"void set_get_meta_test()");
  }
  if (rdoc->deleted != false) {
    fVar1 = fdb_get_metaonly_byseq(db,rdoc);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x357);
      set_get_meta_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x357,"void set_get_meta_test()");
    }
    if (rdoc->deleted == false) {
      __assert_fail("rdoc->deleted == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x358,"void set_get_meta_test()");
    }
    fVar1 = fdb_get_byoffset(db,rdoc);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x35b);
      set_get_meta_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x35b,"void set_get_meta_test()");
    }
    if (rdoc->deleted != false) {
      fdb_doc_free(rdoc);
      fdb_kvs_close(db);
      fdb_close(dbfile);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (set_get_meta_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"set get meta test");
      return;
    }
    __assert_fail("rdoc->deleted == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x35c,"void set_get_meta_test()");
  }
  __assert_fail("rdoc->deleted == true",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x354,"void set_get_meta_test()");
}

Assistant:

void set_get_meta_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    char keybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.purging_interval = 1;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);

    sprintf(keybuf, "key%d", 0);
    fdb_doc_create(&rdoc, keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    fdb_set(db, rdoc);
    status = fdb_get(db, rdoc);
    assert(status == FDB_RESULT_SUCCESS);
    status = fdb_get_byoffset(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_get_metaonly(db, rdoc);
    assert(status == FDB_RESULT_SUCCESS);
    status = fdb_get_metaonly_byseq(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_del(db, rdoc);
    status = fdb_get(db, rdoc);
    assert(status == FDB_RESULT_KEY_NOT_FOUND);
    assert(rdoc->deleted == true);

    status = fdb_get_metaonly(db, rdoc);
    assert(status == FDB_RESULT_SUCCESS);
    assert(rdoc->deleted == true);

    status = fdb_get_metaonly_byseq(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    assert(rdoc->deleted == true);

    status = fdb_get_byoffset(db, rdoc);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    assert(rdoc->deleted == true);


    fdb_doc_free(rdoc);
    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("set get meta test");
}